

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_object.cpp
# Opt level: O2

string * booster::shared_object::name
                   (string *__return_storage_ptr__,string *module,string *soversion)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"lib",module);
  std::operator+(&bStack_78,&local_38,".so");
  std::operator+(&local_58,&bStack_78,".");
  std::operator+(__return_storage_ptr__,&local_58,soversion);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string shared_object::name(std::string const &module,std::string const &soversion)
	{

		#if defined __APPLE__
		return BOOSTER_LIBRARY_PREFIX + module + "." + soversion + BOOSTER_LIBRARY_SUFFIX;
		#elif defined BOOSTER_WIN32
		return BOOSTER_LIBRARY_PREFIX + module + "-" + soversion + BOOSTER_LIBRARY_SUFFIX;
		#else
		return BOOSTER_LIBRARY_PREFIX + module + BOOSTER_LIBRARY_SUFFIX + "." + soversion;
		#endif
	}